

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O0

void ssh2_bpp_new_outgoing_crypto
               (BinaryPacketProtocol *bpp,ssh_cipheralg *cipher,void *ckey,void *iv,ssh2_macalg *mac
               ,_Bool etm_mode,void *mac_key,ssh_compression_alg *compression,
               _Bool delayed_compression)

{
  LogContext *pLVar1;
  Ssh *pSVar2;
  ssh_cipheralg *psVar3;
  char *pcVar4;
  ssh2_mac *psVar5;
  char *pcVar6;
  ssh_compressor *psVar7;
  ssh_compression_alg *psVar8;
  char *pcVar9;
  bool bVar10;
  ptrlen key;
  byte local_69;
  ssh2_bpp_state *s;
  _Bool delayed_compression_local;
  _Bool etm_mode_local;
  ssh2_macalg *mac_local;
  void *iv_local;
  void *ckey_local;
  ssh_cipheralg *cipher_local;
  BinaryPacketProtocol *bpp_local;
  
  if (bpp->vt != &ssh2_bpp_vtable) {
    __assert_fail("bpp->vt == &ssh2_bpp_vtable",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp2.c",
                  0x79,
                  "void ssh2_bpp_new_outgoing_crypto(BinaryPacketProtocol *, const ssh_cipheralg *, const void *, const void *, const ssh2_macalg *, _Bool, const void *, const ssh_compression_alg *, _Bool)"
                 );
  }
  ssh2_bpp_free_outgoing_crypto((ssh2_bpp_state *)&bpp[-2].remote_bugs);
  if (cipher == (ssh_cipheralg *)0x0) {
    bpp[-1].ssh = (Ssh *)0x0;
    *(undefined1 *)&bpp[-1].out_pq.pqb.end.formal_size = 0;
  }
  else {
    pSVar2 = (Ssh *)ssh_cipher_new(cipher);
    bpp[-1].ssh = pSVar2;
    ssh_cipher_setkey((ssh_cipher *)bpp[-1].ssh,ckey);
    ssh_cipher_setiv((ssh_cipher *)bpp[-1].ssh,iv);
    psVar3 = ssh_cipher_alg((ssh_cipher *)bpp[-1].ssh);
    local_69 = 0;
    if ((psVar3->flags & 1) != 0) {
      local_69 = (bpp->remote_bugs & 0x200U) != 0 ^ 0xff;
    }
    *(byte *)&bpp[-1].out_pq.pqb.end.formal_size = local_69 & 1;
    pLVar1 = bpp->logctx;
    psVar3 = ssh_cipher_alg((ssh_cipher *)bpp[-1].ssh);
    pcVar4 = dupprintf("Initialised %s outbound encryption",psVar3->text_name);
    logevent_and_free(pLVar1,pcVar4);
  }
  *(_Bool *)&bpp[-1].ic_in_raw.ctx = etm_mode;
  if (mac == (ssh2_macalg *)0x0) {
    bpp[-1].ic_in_raw.fn = (toplevel_callback_fn_t)0x0;
  }
  else {
    psVar5 = ssh2_mac_new(mac,(ssh_cipher *)bpp[-1].ssh);
    bpp[-1].ic_in_raw.fn = (toplevel_callback_fn_t)psVar5;
    psVar5 = (ssh2_mac *)bpp[-1].ic_in_raw.fn;
    key = make_ptrlen(mac_key,(long)mac->keylen);
    ssh2_mac_setkey(psVar5,key);
    pLVar1 = bpp->logctx;
    pcVar4 = ssh2_mac_text_name((ssh2_mac *)bpp[-1].ic_in_raw.fn);
    pcVar6 = anon_var_dwarf_23ee3 + 10;
    if (etm_mode) {
      pcVar6 = " (in ETM mode)";
    }
    bVar10 = false;
    if (bpp[-1].ssh != (Ssh *)0x0) {
      psVar3 = ssh_cipher_alg((ssh_cipher *)bpp[-1].ssh);
      bVar10 = psVar3->required_mac != (ssh2_macalg *)0x0;
    }
    pcVar9 = anon_var_dwarf_23ee3 + 10;
    if (bVar10) {
      pcVar9 = " (required by cipher)";
    }
    pcVar4 = dupprintf("Initialised %s outbound MAC algorithm%s%s",pcVar4,pcVar6,pcVar9);
    logevent_and_free(pLVar1,pcVar4);
  }
  if ((delayed_compression) && ((bpp[-1].ic_out_pq.field_0x13 & 1) == 0)) {
    *(ssh_compression_alg **)&bpp[-1].ic_in_raw.queued = compression;
    bpp[-1].ic_out_pq.ctx = (void *)0x0;
    pLVar1 = bpp->logctx;
    pcVar4 = dupprintf("Will enable %s compression after user authentication",
                       *(undefined8 *)(*(long *)&bpp[-1].ic_in_raw.queued + 0x40));
    logevent_and_free(pLVar1,pcVar4);
  }
  else {
    *(undefined8 *)&bpp[-1].ic_in_raw.queued = 0;
    psVar7 = ssh_compressor_new(compression);
    bpp[-1].ic_out_pq.ctx = psVar7;
    if (bpp[-1].ic_out_pq.ctx != (void *)0x0) {
      pLVar1 = bpp->logctx;
      psVar8 = ssh_compressor_alg((ssh_compressor *)bpp[-1].ic_out_pq.ctx);
      pcVar4 = dupprintf("Initialised %s compression",psVar8->text_name);
      logevent_and_free(pLVar1,pcVar4);
    }
  }
  return;
}

Assistant:

void ssh2_bpp_new_outgoing_crypto(
    BinaryPacketProtocol *bpp,
    const ssh_cipheralg *cipher, const void *ckey, const void *iv,
    const ssh2_macalg *mac, bool etm_mode, const void *mac_key,
    const ssh_compression_alg *compression, bool delayed_compression)
{
    struct ssh2_bpp_state *s;
    assert(bpp->vt == &ssh2_bpp_vtable);
    s = container_of(bpp, struct ssh2_bpp_state, bpp);

    ssh2_bpp_free_outgoing_crypto(s);

    if (cipher) {
        s->out.cipher = ssh_cipher_new(cipher);
        ssh_cipher_setkey(s->out.cipher, ckey);
        ssh_cipher_setiv(s->out.cipher, iv);

        s->cbc_ignore_workaround = (
            (ssh_cipher_alg(s->out.cipher)->flags & SSH_CIPHER_IS_CBC) &&
            !(s->bpp.remote_bugs & BUG_CHOKES_ON_SSH2_IGNORE));

        bpp_logevent("Initialised %s outbound encryption",
                     ssh_cipher_alg(s->out.cipher)->text_name);
    } else {
        s->out.cipher = NULL;
        s->cbc_ignore_workaround = false;
    }
    s->out.etm_mode = etm_mode;
    if (mac) {
        s->out.mac = ssh2_mac_new(mac, s->out.cipher);
        ssh2_mac_setkey(s->out.mac, make_ptrlen(mac_key, mac->keylen));

        bpp_logevent("Initialised %s outbound MAC algorithm%s%s",
                     ssh2_mac_text_name(s->out.mac),
                     etm_mode ? " (in ETM mode)" : "",
                     (s->out.cipher &&
                      ssh_cipher_alg(s->out.cipher)->required_mac ?
                      " (required by cipher)" : ""));
    } else {
        s->out.mac = NULL;
    }

    if (delayed_compression && !s->seen_userauth_success) {
        s->out.pending_compression = compression;
        s->out_comp = NULL;

        bpp_logevent("Will enable %s compression after user authentication",
                     s->out.pending_compression->text_name);
    } else {
        s->out.pending_compression = NULL;

        /* 'compression' is always non-NULL, because no compression is
         * indicated by ssh_comp_none. But this setup call may return a
         * null out_comp. */
        s->out_comp = ssh_compressor_new(compression);

        if (s->out_comp)
            bpp_logevent("Initialised %s compression",
                         ssh_compressor_alg(s->out_comp)->text_name);
    }
}